

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3WalEndReadTransaction(Wal *pWal)

{
  sqlite3WalEndWriteTransaction(pWal);
  if (-1 < pWal->readLock) {
    if (pWal->exclusiveMode == '\0') {
      (*pWal->pDbFd->pMethods->xShmLock)(pWal->pDbFd,(ushort)pWal->readLock + 3,1,5);
    }
    pWal->readLock = -1;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3WalEndReadTransaction(Wal *pWal){
  sqlite3WalEndWriteTransaction(pWal);
  if( pWal->readLock>=0 ){
    walUnlockShared(pWal, WAL_READ_LOCK(pWal->readLock));
    pWal->readLock = -1;
  }
}